

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O0

void __thiscall File::~File(File *this)

{
  long *in_RDI;
  
  if (-1 < (int)in_RDI[1]) {
    flock((int)in_RDI[1],8);
  }
  if (*in_RDI != 0) {
    fclose((FILE *)*in_RDI);
  }
  return;
}

Assistant:

~File() {
        if (fd >= 0) {
#    ifdef _WIN32
            if (hFile != INVALID_HANDLE_VALUE) {
                OVERLAPPED overlapped = {};
                UnlockFileEx(hFile, 0, MAXDWORD, MAXDWORD, &overlapped);
            }
#    else
            flock(fd, LOCK_UN);
#    endif
        }

        if (file) {
            fclose(file);
        }
    }